

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::length_function::evaluate
          (length_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this_00;
  json_type jVar2;
  reference pbVar3;
  reference pbVar4;
  assertion_error *this_01;
  string_view_type sVar5;
  string_view_type sVar6;
  type_conflict2 length;
  string local_38;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_01,&local_38);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (ppVar1->type_ != value) {
LAB_0037fb16:
    std::error_code::operator=(ec,invalid_type);
    pbVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ::null_value(context);
    return pbVar3;
  }
  this_00 = (ppVar1->field_1).value_;
  jVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type(this_00);
  if (jVar2 - 8 < 2) {
    local_38._M_dataplus._M_p =
         (pointer)basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                            (this_00);
    pbVar4 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ::create_json<unsigned_long>(context,(unsigned_long *)&local_38);
  }
  else {
    if (jVar2 != string_value) goto LAB_0037fb16;
    sVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            as_string_view(this_00);
    sVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            as_string_view(this_00);
    local_38._M_dataplus._M_p =
         (pointer)unicode_traits::count_codepoints<char>(sVar5._M_str,sVar6._M_len,strict);
    pbVar4 = eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
             ::create_json<unsigned_long&>
                       ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                         *)context,(unsigned_long *)&local_38);
  }
  return pbVar4;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();

                switch (arg0.type())
                {
                    case json_type::object_value:
                    case json_type::array_value:
                        return *context.create_json(arg0.size());
                    case json_type::string_value:
                    {
                        auto sv0 = arg0.template as<string_view_type>();
                        auto length = unicode_traits::count_codepoints(sv0.data(), sv0.size());
                        return *context.create_json(length);
                    }
                    default:
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                }
            }